

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astReturnNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_16_2_64505bd7 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.returnNode = (sysbvm_astReturnNode_t *)0x0;
  gcFrame.analyzedExpression = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 2;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  gcFrame.returnNode = (sysbvm_astReturnNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.returnNode)->super).analyzerToken = sVar1;
  ((gcFrame.returnNode)->super).analyzedType = (context->roots).controlFlowReturnType;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.returnNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  if ((gcFrame.returnNode)->expression != 0) {
    gcFrame.analyzedExpression =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,(gcFrame.returnNode)->expression,arguments[1]);
    (gcFrame.returnNode)->expression = gcFrame.analyzedExpression;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return (sysbvm_tuple_t)gcFrame.returnNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astReturnNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astReturnNode_t *returnNode;
        sysbvm_tuple_t analyzedExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.returnNode = (sysbvm_astReturnNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.returnNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.returnNode->super.analyzedType = context->roots.controlFlowReturnType;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.returnNode->super.sourcePosition);

    if(gcFrame.returnNode->expression)
    {
        // TODO: Coerce the value onto the current expected result type.
        gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.returnNode->expression, *environment);
        gcFrame.returnNode->expression = gcFrame.analyzedExpression;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.returnNode;
}